

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool *this;
  long lVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  uint64_t uVar5;
  char *pcVar6;
  long *plVar7;
  element_type *peVar8;
  uint8_t *first;
  uint8_t *puVar9;
  Hexdumper<unsigned_char> local_220;
  undefined4 local_20c;
  long local_208;
  long local_200;
  filehandle local_1f8;
  uint64_t local_1e8;
  undefined1 local_1e0 [8];
  shared_ptr<mappedmem> mmem;
  filehandle f;
  uint64_t local_1b8;
  int64_t local_1b0;
  _Storage<long,_true> local_1a8;
  _Storage<long,_true> local_1a0;
  int64_t local_198;
  _Storage<long,_true> local_190;
  _Storage<long,_true> local_188;
  int64_t local_180;
  _Storage<long,_true> local_178;
  _Storage<long,_true> local_170;
  int64_t local_168;
  _Storage<long,_true> local_160;
  _Storage<long,_true> local_158;
  ArgIterator *local_150;
  ArgIterator *arg;
  ArgIterator __end1;
  ArgIterator __begin1;
  ArgParser local_e8;
  ArgParser *local_d8;
  ArgParser *__range1;
  int argsfound;
  int processId;
  DumpParams params;
  string dstFilename;
  string srcFilename;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(dstFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&params.summarizeThreshold);
  DumpParams::DumpParams((DumpParams *)&argsfound);
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  ArgParser::ArgParser(&local_e8,argc,argv);
  local_d8 = &local_e8;
  ArgParser::begin((ArgIterator *)&__end1.longmatch,local_d8);
  ArgParser::end((ArgIterator *)&arg,local_d8);
  while (bVar2 = operator!=((ArgIterator *)&__end1.longmatch,(ArgIterator *)&arg), bVar2) {
    local_150 = ArgParser::ArgIterator::operator*((ArgIterator *)&__end1.longmatch);
    iVar3 = ArgParser::ArgIterator::option(local_150);
    switch(iVar3) {
    default:
      usage();
      argv_local._4_4_ = 1;
      goto LAB_00103c8e;
    case 0x31:
    case 0x32:
    case 0x34:
    case 0x38:
      iVar3 = ArgParser::ArgIterator::option(local_150);
      params.fileSize.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_4_ = iVar3 + -0x30;
      break;
    case 0x53:
      local_1b8 = ArgParser::ArgIterator::getuint(local_150);
      std::optional<int>::operator=((optional<int> *)&params.dumpformat,&local_1b8);
      break;
    case 0x62:
      local_168 = ArgParser::ArgIterator::getint(local_150);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_160,&local_168);
      params.length.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_160;
      params.baseOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload = local_158;
      break;
    case 0x65:
      local_198 = ArgParser::ArgIterator::getint(local_150);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_190,&local_198);
      params.offset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_190;
      params.endOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload = local_188;
      break;
    case 0x66:
      params.stepSize._4_1_ = 0;
      break;
    case 0x6c:
      local_1b0 = ArgParser::ArgIterator::getint(local_150);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_1a8,&local_1b0);
      params.endOffset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = local_1a8;
      params.length.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload = local_1a0;
      break;
    case 0x6f:
      local_180 = ArgParser::ArgIterator::getint(local_150);
      std::optional<long>::optional<long,_true>((optional<long> *)&local_178,&local_180);
      _argsfound = local_178;
      params.offset.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload = local_170;
      break;
    case 0x70:
      iVar4 = ArgParser::ArgIterator::getint(local_150);
      __range1._4_4_ = (int)iVar4;
      break;
    case 0x73:
      params._80_8_ = ArgParser::ArgIterator::getuint(local_150);
      break;
    case 0x77:
      uVar5 = ArgParser::ArgIterator::getuint(local_150);
      params.fileSize.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._12_4_ = SUB84(uVar5,0);
      break;
    case 0x78:
      iVar3 = ArgParser::ArgIterator::count(local_150);
      if (iVar3 == 2) {
        params.stepSize._0_4_ = 2;
      }
      else {
        params.stepSize._0_4_ = 1;
      }
      break;
    case -1:
      iVar3 = (int)__range1 + 1;
      if ((int)__range1 == 0) {
        __range1._0_4_ = iVar3;
        pcVar6 = ArgParser::ArgIterator::getstr(local_150);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dstFilename.field_2 + 8),pcVar6);
      }
      else {
        bVar2 = (int)__range1 == 1;
        __range1._0_4_ = iVar3;
        if (bVar2) {
          pcVar6 = ArgParser::ArgIterator::getstr(local_150);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &params.summarizeThreshold,pcVar6);
        }
      }
    }
    ArgParser::ArgIterator::operator++((ArgIterator *)&__end1.longmatch);
  }
  if ((__range1._4_4_ == 0) && (((int)__range1 == 0 || (2 < (int)__range1)))) {
    usage();
    argv_local._4_4_ = 1;
    goto LAB_00103c8e;
  }
  DumpParams::resolveLineFormat((DumpParams *)&argsfound);
  filehandle::filehandle
            ((filehandle *)
             &mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<mappedmem>::shared_ptr((shared_ptr<mappedmem> *)local_1e0);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&dstFilename.field_2 + 8));
  if (bVar2) {
LAB_00103b76:
    DumpParams::applyFormat((DumpParams *)&argsfound,(ostream *)&std::cout);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e0);
    if (bVar2) {
      peVar8 = std::__shared_ptr_access<mappedmem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mappedmem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1e0);
      first = mappedmem::data(peVar8);
      peVar8 = std::__shared_ptr_access<mappedmem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mappedmem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1e0);
      puVar9 = mappedmem::data(peVar8);
      plVar7 = std::optional<long>::operator*
                         ((optional<long> *)
                          &params.endOffset.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_engaged);
      local_220 = Hex::dumper<unsigned_char>(first,puVar9 + *plVar7);
      Hex::operator<<((ostream *)&std::cout,&local_220);
      argv_local._4_4_ = 0;
    }
    else {
      printf("Nothing to do\n");
      argv_local._4_4_ = 1;
    }
  }
  else {
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&dstFilename.field_2 + 8));
    iVar3 = open(pcVar6,0);
    filehandle::operator=
              ((filehandle *)
               &mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount,iVar3);
    local_1e8 = filehandle::size((filehandle *)
                                 &mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
    std::optional<long>::operator=
              ((optional<long> *)
               &params.baseOffset.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged,&local_1e8);
    bVar2 = DumpParams::resolveSizes((DumpParams *)&argsfound);
    if (bVar2) {
      plVar7 = std::optional<long>::operator*((optional<long> *)&argsfound);
      lVar1 = *plVar7;
      this = &params.length.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged;
      plVar7 = std::optional<long>::operator*((optional<long> *)this);
      local_200 = lVar1 - *plVar7;
      plVar7 = std::optional<long>::operator*
                         ((optional<long> *)
                          &params.offset.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_engaged);
      lVar1 = *plVar7;
      plVar7 = std::optional<long>::operator*((optional<long> *)this);
      local_208 = lVar1 - *plVar7;
      local_20c = 1;
      std::make_shared<mappedmem,filehandle&,long,long,int>
                (&local_1f8,
                 (long *)&mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,&local_200,(int *)&local_208);
      std::shared_ptr<mappedmem>::operator=
                ((shared_ptr<mappedmem> *)local_1e0,(shared_ptr<mappedmem> *)&local_1f8);
      std::shared_ptr<mappedmem>::~shared_ptr((shared_ptr<mappedmem> *)&local_1f8);
      goto LAB_00103b76;
    }
    argv_local._4_4_ = 1;
  }
  std::shared_ptr<mappedmem>::~shared_ptr((shared_ptr<mappedmem> *)local_1e0);
  filehandle::~filehandle
            ((filehandle *)
             &mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00103c8e:
  std::__cxx11::string::~string((string *)&params.summarizeThreshold);
  std::__cxx11::string::~string((string *)(dstFilename.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char**argv)
{
    std::string srcFilename;
    std::string dstFilename;
    DumpParams params;
    int processId = 0;

    int argsfound = 0; 
    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
          // options from 'dump', not yet implemented:
          //   -h  : dump hashes
          //   -ripemd160
          //   -sha1, -sha2, -sha3, -sha5, -sum
          //   -md5, -md2, -md4, -md160
          //   -a : strings
          //   -crc
          //   -c : raw selected data to stdout.
          //   -r SIZE  : specify readchunk
          //
          // todo: add choice of reading via stdio, or via mmap
          // todo: add choice of outputting a hexdump, rawdata, stringdump, to dstFilename

            case 'b': params.baseOffset = arg.getint(); break;  // the offset at file pos 0
            case 'o': params.offset = arg.getint(); break;
            case 'e': params.endOffset = arg.getint(); break;
            case 'l': params.length = arg.getint(); break;
            case 'p': processId = arg.getint(); break;

            case 'w': params.unitsPerLine = arg.getuint(); break;
            case 's': params.stepSize = arg.getuint(); break;
            case 'f': params.summarize = false; break;
            case 'S': params.summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          params.dumpformat = DUMP_ASCII; 
                      else
                          params.dumpformat = DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                params.dumpUnitSize = arg.option()-'0';
                break;

            case -1:
                switch (argsfound++) {
                    case 0: srcFilename = arg.getstr(); break;
                    case 1: dstFilename = arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }

    if (processId==0 && (argsfound==0 || argsfound>2))
    {
        usage();
        return 1;
    }

    params.resolveLineFormat();

    filehandle f;
#ifdef __MACH__
    std::shared_ptr<MachVirtualMemory> vmem;
#endif
    std::shared_ptr<mappedmem> mmem;

    if (!srcFilename.empty()) {
        f = open(srcFilename.c_str(), O_RDONLY);
        params.fileSize = f.size();

        if (!params.resolveSizes())
            return 1;
        mmem = std::make_shared<mappedmem>(f, *params.offset - *params.baseOffset, *params.endOffset - *params.baseOffset, PROT_READ);
    }
#ifdef __MACH__
    else if (processId) {
        try {
        task_t task = MachOpenProcessByPid(processId);
        vmem = std::make_shared<MachVirtualMemory>(task, *params.offset, *params.length);
        }
        catch(std::exception& e)
        {
            std::cout << "ERROR " << e.what() << "\n";
        }
    }
#endif

    params.applyFormat(std::cout);

    if (mmem)
        std::cout << Hex::dumper(mmem->data(), mmem->data()+*params.length);
#ifdef __MACH__
    else if (vmem)
        std::cout << Hex::dumper(vmem->begin(), vmem->end());
#endif
    else {
        printf("Nothing to do\n");
        return 1;
    }